

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::cleanAfterTest
          (TextureCubeMapArrayStencilAttachments *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayStencilAttachments *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  (**(code **)(lVar3 + 0xb8))(0x9009,0);
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_id);
    this->m_program_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fragment_shader_id);
    this->m_fragment_shader_id = 0;
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_geometry_shader_id);
    this->m_geometry_shader_id = 0;
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id);
    this->m_vertex_shader_id = 0;
  }
  if (this->m_texture_cube_array_color_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_cube_array_color_id);
    this->m_texture_cube_array_color_id = 0;
  }
  if (this->m_texture_cube_array_stencil_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_cube_array_stencil_id);
    this->m_texture_cube_array_stencil_id = 0;
  }
  if (this->m_result_data != (GLubyte *)0x0) {
    if (this->m_result_data != (GLubyte *)0x0) {
      operator_delete__(this->m_result_data);
    }
    this->m_result_data = (GLubyte *)0x0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::cleanAfterTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
	gl.useProgram(0);

	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);

		m_fragment_shader_id = 0;
	}

	if (m_geometry_shader_id != 0)
	{
		gl.deleteShader(m_geometry_shader_id);

		m_geometry_shader_id = 0;
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);

		m_vertex_shader_id = 0;
	}

	if (m_texture_cube_array_color_id != 0)
	{
		gl.deleteTextures(1, &m_texture_cube_array_color_id);

		m_texture_cube_array_color_id = 0;
	}

	if (m_texture_cube_array_stencil_id != 0)
	{
		gl.deleteTextures(1, &m_texture_cube_array_stencil_id);

		m_texture_cube_array_stencil_id = 0;
	}

	if (m_result_data != DE_NULL)
	{
		delete[] m_result_data;

		m_result_data = DE_NULL;
	}
}